

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void find_headers(path *dir,
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 *headers)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  path *__p;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auVar7 [16];
  recursive_directory_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  HDR_EXT;
  path file;
  recursive_directory_iterator rStack_e8;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string_type local_b8;
  undefined1 local_98 [32];
  _List local_78 [2];
  undefined8 local_68 [2];
  path local_58;
  
  local_98._0_8_ = local_98 + 0x10;
  local_d8 = headers;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,".h","");
  _Var5._M_head_impl = (_Impl *)local_68;
  local_78[0]._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var5._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,".hpp","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l,(allocator_type *)&local_58);
  lVar6 = -0x40;
  do {
    if ((_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         )_Var5._M_head_impl !=
        (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)
        *(tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          *)&((tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               *)(_Var5._M_head_impl + -0x10))->
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ) {
      operator_delete((void *)*(tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                *)&((tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                     *)(_Var5._M_head_impl + -0x10))->
                                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ,*(long *)_Var5._M_head_impl + 1);
    }
    _Var5._M_head_impl = _Var5._M_head_impl + -0x20;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&rStack_e8,dir,none,(error_code *)0x0);
  while( true ) {
    _Var1._M_pi = rStack_e8._M_dirs._M_refcount._M_pi;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_98);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&rStack_e8);
    std::filesystem::__cxx11::path::path((path *)local_98,__p);
    pbVar3 = local_d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = local_d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar7 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar7._8_8_ == -1 || auVar7._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_58);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,auVar7._0_8_);
      std::filesystem::__cxx11::path::path(&local_58,&local_b8,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::filesystem::__cxx11::path_const>>
                      (pbVar2,pbVar3,&local_58);
    pbVar2 = local_d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::filesystem::__cxx11::path::~path(&local_58);
    if (_Var4._M_current != pbVar2) {
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      push_back(local_d8,(path *)local_98);
    }
    std::filesystem::__cxx11::path::~path((path *)local_98);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&rStack_e8);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&rStack_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  return;
}

Assistant:

void find_headers(fs::path dir, std::vector<fs::path> &headers) {
  const std::vector<std::string> HDR_EXT = {".h", ".hpp"};
  for (fs::recursive_directory_iterator it(dir);
       it != fs::recursive_directory_iterator(); ++it) {
    fs::path file = it->path();
    if (std::find(HDR_EXT.begin(), HDR_EXT.end(), file.extension()) !=
        HDR_EXT.end()) {
      headers.push_back(file);
    }
  }
}